

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O0

void sat_solver3_canceluntil_rollback(sat_solver3 *s,int NewBound)

{
  int iVar1;
  int local_18;
  int x;
  int c;
  int NewBound_local;
  sat_solver3 *s_local;
  
  iVar1 = sat_solver3_dl(s);
  if (iVar1 != 0) {
    __assert_fail("sat_solver3_dl(s) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                  ,0x2a8,"void sat_solver3_canceluntil_rollback(sat_solver3 *, int)");
  }
  if (s->qtail == s->qhead) {
    if (NewBound <= s->qtail) {
      local_18 = s->qtail;
      while (local_18 = local_18 + -1, NewBound <= local_18) {
        iVar1 = lit_var(s->trail[local_18]);
        var_set_value(s,iVar1,3);
        s->reasons[iVar1] = 0;
      }
      local_18 = s->qhead;
      while (local_18 = local_18 + -1, NewBound <= local_18) {
        iVar1 = lit_var(s->trail[local_18]);
        order_unassigned(s,iVar1);
      }
      s->qtail = NewBound;
      s->qhead = NewBound;
      return;
    }
    __assert_fail("s->qtail >= NewBound",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                  ,0x2aa,"void sat_solver3_canceluntil_rollback(sat_solver3 *, int)");
  }
  __assert_fail("s->qtail == s->qhead",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                ,0x2a9,"void sat_solver3_canceluntil_rollback(sat_solver3 *, int)");
}

Assistant:

static void sat_solver3_canceluntil_rollback(sat_solver3* s, int NewBound) {
    int      c, x;
   
    assert( sat_solver3_dl(s) == 0 );
    assert( s->qtail == s->qhead );
    assert( s->qtail >= NewBound );

    for (c = s->qtail-1; c >= NewBound; c--) 
    {
        x = lit_var(s->trail[c]);
        var_set_value(s, x, varX);
        s->reasons[x] = 0;
    }

    for (c = s->qhead-1; c >= NewBound; c--)
        order_unassigned(s,lit_var(s->trail[c]));

    s->qhead = s->qtail = NewBound;
}